

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::Initialize
          (JsBuiltInEngineInterfaceExtensionObject *this)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  JavascriptLibrary *this_00;
  EngineInterfaceObject *pEVar4;
  DynamicObject *pDVar5;
  undefined4 *puVar6;
  Recycler *recycler;
  ScriptContext **ppSVar7;
  DeferredTypeHandler<&Js::JsBuiltInEngineInterfaceExtensionObject::InitializeJsBuiltInNativeInterfaces,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler;
  DynamicType *type;
  DynamicObject **ppDVar8;
  DynamicObject *commonObject;
  JavascriptLibrary *library;
  JsBuiltInEngineInterfaceExtensionObject *this_local;
  
  if ((this->wasInitialized & 1U) == 0) {
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_EngineExtensionObjectBase).scriptContext);
    this_00 = ScriptContext::GetLibrary(pSVar3);
    pEVar4 = JavascriptLibraryBase::GetEngineInterfaceObject(&this_00->super_JavascriptLibraryBase);
    pDVar5 = EngineInterfaceObject::GetCommonNativeInterfaces(pEVar4);
    pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_EngineExtensionObjectBase).scriptContext);
    bVar2 = ScriptContext::IsJsBuiltInEnabled(pSVar3);
    if (bVar2) {
      pEVar4 = JavascriptLibraryBase::GetEngineInterfaceObject
                         (&this_00->super_JavascriptLibraryBase);
      if (pEVar4 == (EngineInterfaceObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                    ,0x3c,"(library->GetEngineInterfaceObject() != nullptr)",
                                    "library->GetEngineInterfaceObject() != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      recycler = JavascriptLibrary::GetRecycler(this_00);
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_EngineExtensionObjectBase).scriptContext
                          );
      pSVar3 = *ppSVar7;
      typeHandler = DeferredTypeHandler<&Js::JsBuiltInEngineInterfaceExtensionObject::InitializeJsBuiltInNativeInterfaces,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                    ::GetDefaultInstance();
      type = DynamicType::New(pSVar3,TypeIds_Object,&pDVar5->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler,false,false);
      pDVar5 = DynamicObject::New(recycler,type);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->builtInNativeInterfaces,pDVar5);
      pEVar4 = JavascriptLibraryBase::GetEngineInterfaceObject
                         (&this_00->super_JavascriptLibraryBase);
      ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                          ((WriteBarrierPtr *)&this->builtInNativeInterfaces);
      JavascriptLibrary::AddMember(this_00,&pEVar4->super_DynamicObject,0x59,*ppDVar8);
    }
    this->wasInitialized = true;
  }
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::Initialize()
    {
        if (wasInitialized)
        {
            return;
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        DynamicObject* commonObject = library->GetEngineInterfaceObject()->GetCommonNativeInterfaces();
        if (scriptContext->IsJsBuiltInEnabled())
        {
            Assert(library->GetEngineInterfaceObject() != nullptr);
            builtInNativeInterfaces = DynamicObject::New(library->GetRecycler(),
                DynamicType::New(scriptContext, TypeIds_Object, commonObject, nullptr,
                    DeferredTypeHandler<InitializeJsBuiltInNativeInterfaces>::GetDefaultInstance()));
            library->AddMember(library->GetEngineInterfaceObject(), Js::PropertyIds::JsBuiltIn, builtInNativeInterfaces);
        }

        wasInitialized = true;
    }